

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
          (internal *this,char *expected_expression,char *actual_expression,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected,
          char (*actual) [7])

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual_expression_00;
  char *expected_expression_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar3;
  string local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  char (*actual_local) [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected_local;
  char *actual_expression_local;
  char *expected_expression_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)actual;
  actual_local = (char (*) [7])expected;
  expected_local =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)actual_expression;
  actual_expression_local = expected_expression;
  expected_expression_local = (char *)this;
  bVar1 = std::operator==(expected,*actual);
  expected_expression_00 = actual_expression_local;
  actual_expression_00 = expected_local;
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    FormatForComparisonFailureMessage<std::__cxx11::string,char[7]>
              (&local_50,(internal *)actual_local,local_30,(char (*) [7])expected);
    FormatForComparisonFailureMessage<char[7],std::__cxx11::string>
              (&local_70,(internal *)local_30,actual_local,expected);
    EqFailure(this,expected_expression_00,(char *)actual_expression_00,&local_50,&local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}